

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Or::jumping(Or *this,int t,int f)

{
  element_type *peVar1;
  uint local_2c;
  int label;
  int f_local;
  int t_local;
  Or *this_local;
  
  local_2c = t;
  if (t == 0) {
    local_2c = Node::newlabel((Node *)this);
  }
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Logical).expr1);
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,(ulong)local_2c,0);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Logical).expr2);
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,(ulong)(uint)t,(ulong)(uint)f);
  if (t == 0) {
    Node::emitlabel((Node *)this,local_2c);
  }
  return;
}

Assistant:

void jumping(int t, int f) override {
		int label = t != 0 ? t : newlabel();
		expr1->jumping(label, 0);
		expr2->jumping(t, f);
		if (t == 0) emitlabel(label);

	}